

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t archive_read_format_zip_cleanup(archive_read *a)

{
  archive_string *as;
  void *pvVar1;
  void *__ptr;
  
  as = (archive_string *)a->format->data;
  if (*(char *)&as[0xc].s != '\0') {
    cm_zlib_inflateEnd((z_streamp)&as[7].length);
  }
  free((void *)as[6].buffer_length);
  __ptr = (void *)as[2].length;
  while (__ptr != (void *)0x0) {
    pvVar1 = *(void **)((long)__ptr + 0x18);
    archive_string_free((archive_string *)((long)__ptr + 0x48));
    free(__ptr);
    __ptr = pvVar1;
  }
  free(as[0xe].s);
  if (*(char *)((long)&as[0x10].length + 4) != '\0') {
    aes_ctr_release((archive_crypto_ctx *)&as[0x10].length);
  }
  if (*(char *)((long)&as[0x10].buffer_length + 4) != '\0') {
    __hmac_sha1_cleanup((archive_hmac_sha1_ctx *)&as[0x10].buffer_length);
  }
  free((void *)as[0x12].length);
  free((void *)as[0x12].buffer_length);
  free(as[0x13].s);
  archive_string_free(as);
  free(as);
  a->format->data = (void *)0x0;
  return L'\0';
}

Assistant:

static int
archive_read_format_zip_cleanup(struct archive_read *a)
{
	struct zip *zip;
	struct zip_entry *zip_entry, *next_zip_entry;

	zip = (struct zip *)(a->format->data);
#ifdef HAVE_ZLIB_H
	if (zip->stream_valid)
		inflateEnd(&zip->stream);
	free(zip->uncompressed_buffer);
#endif
	if (zip->zip_entries) {
		zip_entry = zip->zip_entries;
		while (zip_entry != NULL) {
			next_zip_entry = zip_entry->next;
			archive_string_free(&zip_entry->rsrcname);
			free(zip_entry);
			zip_entry = next_zip_entry;
		}
	}
	free(zip->decrypted_buffer);
	if (zip->cctx_valid)
		archive_decrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	free(zip->iv);
	free(zip->erd);
	free(zip->v_data);
	archive_string_free(&zip->format_name);
	free(zip);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}